

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_SimpleString_Contains_TestShell::createTest(TEST_SimpleString_Contains_TestShell *this)

{
  TEST_SimpleString_Contains_Test *this_00;
  
  this_00 = (TEST_SimpleString_Contains_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x14d);
  TEST_SimpleString_Contains_Test::TEST_SimpleString_Contains_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, Contains)
{
    SimpleString s("hello!");
    SimpleString empty("");
    SimpleString beginning("hello");
    SimpleString end("lo!");
    SimpleString mid("l");
    SimpleString notPartOfString("xxxx");

    CHECK(s.contains(empty));
    CHECK(s.contains(beginning));
    CHECK(s.contains(end));
    CHECK(s.contains(mid));
    CHECK(!s.contains(notPartOfString));

    CHECK(empty.contains(empty));
    CHECK(!empty.contains(s));
}